

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_ffh_tonumber(lua_State *L)

{
  byte bVar1;
  byte bVar2;
  int32_t __base;
  int iVar3;
  uint uVar4;
  byte *in_RAX;
  TValue *o;
  GCstr *pGVar5;
  ulong uVar6;
  CType *pCVar7;
  undefined1 *puVar8;
  byte *__nptr;
  CTState *cts;
  lua_Number lVar9;
  undefined1 auVar10 [16];
  byte *local_38;
  
  local_38 = in_RAX;
  __base = lj_lib_optint(L,2,10);
  if (__base == 10) {
    o = lj_lib_checkany(L,1);
    uVar4 = (o->field_2).it;
    if (uVar4 < 0xffff0000) {
LAB_00118fd2:
      L->base[-1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)o;
      return 2;
    }
    if (uVar4 == 0xfffffffb) {
      iVar3 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
      if (iVar3 != 0) goto LAB_00118fd2;
      uVar4 = (o->field_2).it;
    }
    if (uVar4 == 0xfffffff5) {
      cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
      cts->L = L;
      pCVar7 = lj_ctype_rawref(cts,(uint)*(ushort *)((ulong)(o->u32).lo + 6));
      uVar4 = pCVar7->info;
      if ((uVar4 & 0xf0000000) == 0x50000000) {
        uVar4 = *(uint *)((long)&cts->tab->info + (ulong)((uVar4 & 0xffff) << 4));
      }
      if (uVar4 < 0x10000000 || (uVar4 & 0xf4000000) == 0x34000000) {
        lj_cconv_ct_tv(cts,cts->tab + 0xe,(uint8_t *)&L->base[-1].u64,o,0);
        return 2;
      }
    }
  }
  else {
    pGVar5 = lj_lib_checkstr(L,1);
    if (__base - 0x25U < 0xffffffdd) {
      lj_err_arg(L,2,LJ_ERR_BASERNG);
    }
    puVar8 = (undefined1 *)((long)&pGVar5->len + 3);
    do {
      bVar1 = puVar8[1];
      puVar8 = puVar8 + 1;
    } while ((""[(ulong)bVar1 + 1] & 2) != 0);
    __nptr = puVar8 + ((bVar1 - 0x2b & 0xfd) == 0);
    if (((""[(ulong)*__nptr + 1] & 0x68) != 0) &&
       (uVar6 = strtoul((char *)__nptr,(char **)&local_38,__base), __nptr != local_38)) {
      do {
        bVar2 = *local_38;
        local_38 = local_38 + 1;
      } while ((""[(ulong)bVar2 + 1] & 2) != 0);
      if (bVar2 == 0) {
        auVar10._8_4_ = (int)(uVar6 >> 0x20);
        auVar10._0_8_ = uVar6;
        auVar10._12_4_ = 0x45300000;
        lVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
        if (bVar1 == 0x2d) {
          lVar9 = -lVar9;
        }
        L->base[-1].n = lVar9;
        return 2;
      }
    }
  }
  *(undefined4 *)((long)L->base + -4) = 0xffffffff;
  return 2;
}

Assistant:

LJLIB_ASM(tonumber)		LJLIB_REC(.)
{
  int32_t base = lj_lib_optint(L, 2, 10);
  if (base == 10) {
    TValue *o = lj_lib_checkany(L, 1);
    if (lj_strscan_numberobj(o)) {
      copyTV(L, L->base-1-LJ_FR2, o);
      return FFH_RES(1);
    }
#if LJ_HASFFI
    if (tviscdata(o)) {
      CTState *cts = ctype_cts(L);
      CType *ct = lj_ctype_rawref(cts, cdataV(o)->ctypeid);
      if (ctype_isenum(ct->info)) ct = ctype_child(cts, ct);
      if (ctype_isnum(ct->info) || ctype_iscomplex(ct->info)) {
	if (LJ_DUALNUM && ctype_isinteger_or_bool(ct->info) &&
	    ct->size <= 4 && !(ct->size == 4 && (ct->info & CTF_UNSIGNED))) {
	  int32_t i;
	  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o, 0);
	  setintV(L->base-1-LJ_FR2, i);
	  return FFH_RES(1);
	}
	lj_cconv_ct_tv(cts, ctype_get(cts, CTID_DOUBLE),
		       (uint8_t *)&(L->base-1-LJ_FR2)->n, o, 0);
	return FFH_RES(1);
      }
    }
#endif
  } else {
    const char *p = strdata(lj_lib_checkstr(L, 1));
    char *ep;
    unsigned int neg = 0;
    unsigned long ul;
    if (base < 2 || base > 36)
      lj_err_arg(L, 2, LJ_ERR_BASERNG);
    while (lj_char_isspace((unsigned char)(*p))) p++;
    if (*p == '-') { p++; neg = 1; } else if (*p == '+') { p++; }
    if (lj_char_isalnum((unsigned char)(*p))) {
      ul = strtoul(p, &ep, base);
      if (p != ep) {
	while (lj_char_isspace((unsigned char)(*ep))) ep++;
	if (*ep == '\0') {
	  if (LJ_DUALNUM && LJ_LIKELY(ul < 0x80000000u+neg)) {
	    if (neg) ul = ~ul+1u;
	    setintV(L->base-1-LJ_FR2, (int32_t)ul);
	  } else {
	    lua_Number n = (lua_Number)ul;
	    if (neg) n = -n;
	    setnumV(L->base-1-LJ_FR2, n);
	  }
	  return FFH_RES(1);
	}
      }
    }
  }
  setnilV(L->base-1-LJ_FR2);
  return FFH_RES(1);
}